

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O2

OperatorResultType __thiscall
duckdb::PhysicalStreamingWindow::Execute
          (PhysicalStreamingWindow *this,ExecutionContext *context,DataChunk *input,
          DataChunk *output,GlobalOperatorState *gstate_p,OperatorState *state_p)

{
  DataChunk *chunk;
  _func_int **pp_Var1;
  
  if (*(char *)&state_p[1]._vptr_OperatorState == '\0') {
    StreamingWindowState::Initialize
              ((StreamingWindowState *)state_p,context->client,input,&this->select_list);
  }
  chunk = (DataChunk *)(state_p + 0xd);
  pp_Var1 = state_p[0x10]._vptr_OperatorState;
  if (pp_Var1 == (_func_int **)0x0) {
    StreamingWindowState::Reset(chunk);
    pp_Var1 = state_p[0x10]._vptr_OperatorState;
  }
  if (pp_Var1 < state_p[0xc]._vptr_OperatorState) {
    DataChunk::Append(chunk,input,false,(SelectionVector *)0x0,0);
    output->count = 0;
  }
  else if ((_func_int **)input->count < pp_Var1) {
    output->count = input->count;
    ExecuteShifted(this,context,chunk,input,output,gstate_p,state_p);
  }
  else {
    if (pp_Var1 != (_func_int **)0x0) {
      ExecuteDelayed(this,context,chunk,input,output,gstate_p,state_p);
      state_p[0x10]._vptr_OperatorState = (_func_int **)0x0;
      return HAVE_MORE_OUTPUT;
    }
    ExecuteInput(this,context,chunk,input,output,gstate_p,state_p);
  }
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType PhysicalStreamingWindow::Execute(ExecutionContext &context, DataChunk &input, DataChunk &output,
                                                    GlobalOperatorState &gstate_p, OperatorState &state_p) const {
	auto &state = state_p.Cast<StreamingWindowState>();
	if (!state.initialized) {
		state.Initialize(context.client, input, select_list);
	}

	auto &delayed = state.delayed;
	// We can Reset delayed now that no one can be referencing it.
	if (!delayed.size()) {
		state.Reset(delayed);
	}
	if (delayed.size() < state.lead_count) {
		//	If we don't have enough to produce a single row,
		//	then just delay more rows, return nothing
		//	and ask for more data.
		delayed.Append(input);
		output.SetCardinality(0);
		return OperatorResultType::NEED_MORE_INPUT;
	} else if (input.size() < delayed.size()) {
		// If we can't consume all of the delayed values,
		// we need to split them instead of referencing them all
		output.SetCardinality(input.size());
		ExecuteShifted(context, delayed, input, output, gstate_p, state_p);
		// We delayed the unused input so ask for more
		return OperatorResultType::NEED_MORE_INPUT;
	} else if (delayed.size()) {
		//	We have enough delayed rows so flush them
		ExecuteDelayed(context, delayed, input, output, gstate_p, state_p);
		// Defer resetting delayed as it may be referenced.
		delayed.SetCardinality(0);
		// Come back to process the input
		return OperatorResultType::HAVE_MORE_OUTPUT;
	} else {
		//	No delayed rows, so emit what we can and delay the rest.
		ExecuteInput(context, delayed, input, output, gstate_p, state_p);
		return OperatorResultType::NEED_MORE_INPUT;
	}
}